

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void receiveTableCMD(packet_t *recv)

{
  bool bVar1;
  Link *this;
  ostream *poVar2;
  string neighbor;
  routingtable_t neighborRoutingTable;
  stringstream sstrm;
  routerip_t local_218;
  packet_t local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
  local_1d8;
  stringstream local_1a8 [128];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)recv,_S_out|_S_in);
  std::istream::ignore((long)local_1a8,-1);
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::operator>>((istream *)local_1a8,(string *)&local_218);
  this = getLink(&local_218);
  bVar1 = Link::operator==(this,links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                super__Vector_impl_data._M_finish);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"!!! Packet received from Unknown Router: DISCARDED",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  else {
    if (this->status == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"----- link UP with : ",0x15);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->neighbor)._M_dataplus._M_p,
                          (this->neighbor)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -----",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    this->status = 1;
    this->recvClock = currentClock;
    std::__cxx11::string::find((char)recv,10);
    std::__cxx11::string::substr((ulong)&local_1f8,(ulong)recv);
    extractTable((routingtable_t *)&local_1d8,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    updateRoutingTableForNeighbor(&local_218,(routingtable_t *)&local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
    ::~_Rb_tree(&local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void receiveTableCMD(const packet_t &recv) {
	stringstream sstrm(recv);
	sstrm.ignore(std::numeric_limits<streamsize>::max(), ' ');
	string neighbor;
	sstrm >> neighbor;
	Link &link = getLink(neighbor);
	if (link == *links.end()) {
		cout << "!!! Packet received from Unknown Router: DISCARDED" << endl;
		return;
	}
	if (link.status == DOWN) {
		cout << "----- link UP with : " << link.neighbor << " -----" << endl;
	}
	link.status = UP;
	link.recvClock = currentClock;
//	cout << "--------------------------------------" << endl;
//	cout << RECV_ROUTING_TABLE << "> from: " << neighbor << endl;
//	print_container(cout,extractTableFromPacket(recv.substr(16)),"\n");
//	printRoutingMap(extractTable(recv.substr(recv.find('\n') + 1)));
//	cout << "--------------------------------------" << endl;
	routingtable_t neighborRoutingTable = extractTable(recv.substr(recv.find('\n') + 1));
	updateRoutingTableForNeighbor(neighbor, neighborRoutingTable);
}